

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::Constraint::Constraint(Constraint *this,size_t size,string *name)

{
  pointer pcVar1;
  
  this->_vptr_Constraint = (_func_int **)&PTR__Constraint_00199d50;
  this->m_constraintSize = size;
  (this->m_constraintName)._M_dataplus._M_p = (pointer)&(this->m_constraintName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_constraintName,pcVar1,pcVar1 + name->_M_string_length);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_valueBuffer,size & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_lowerBound);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_upperBound);
  this->m_isLowerBounded = false;
  this->m_isUpperBounded = false;
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::resize((ulong)&this->m_lowerBound);
  iDynTree::VectorDynSize::resize((ulong)&this->m_upperBound);
  return;
}

Assistant:

Constraint::Constraint(size_t size, const std::string name)
        : m_constraintSize(size)
        , m_constraintName(name)
        , m_valueBuffer(static_cast<unsigned int>(size))
        , m_isLowerBounded(false)
        , m_isUpperBounded(false)
        {
            m_valueBuffer.zero();
            m_lowerBound.resize(static_cast<unsigned int>(size));
            m_upperBound.resize(static_cast<unsigned int>(size));
        }